

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O0

void calc_statistics(float (*correct_vels) [512] [2],float (*norm_vels1) [512] [2],
                    float (*norm_vels2) [512] [2],int int_size_x,int int_size_y,
                    float (*full_vels) [512] [2],float (*E) [512],int pic_x,int pic_y,int n,
                    float *ave_error,float *st_dev,float *density,float *residual,float *min_angle,
                    float *max_angle,float *norm_ave_error1,float *norm_st_dev1,float *norm_density1
                    ,float *norm_min_angle1,float *norm_max_angle1,float *norm_ave_error2,
                    float *norm_st_dev2,float *norm_density2,float *norm_min_angle2,
                    float *norm_max_angle2)

{
  FILE *__stream;
  float fVar1;
  double dVar2;
  uint local_550;
  int local_54c;
  int bin_ct;
  int int_mag;
  int histogram_count [100];
  float bin_density;
  float bin_st_dev;
  float bin_ave;
  float bin_sum;
  float histogram_error2 [100];
  float histogram_error [100];
  float local_80;
  float local_7c;
  float bin_err2;
  float uve [2];
  float uva [2];
  float temp;
  float sumX2;
  float normal_sumX2_2;
  float normal_sumX2_1;
  int no_norm_count2;
  int norm_count2;
  int total_count;
  int j;
  int i;
  int no_norm_count1;
  int no_full_count;
  int norm_count1;
  int full_count;
  FILE *fp;
  float (*full_vels_local) [512] [2];
  int int_size_y_local;
  int int_size_x_local;
  float (*norm_vels2_local) [512] [2];
  float (*norm_vels1_local) [512] [2];
  float (*correct_vels_local) [512] [2];
  
  no_norm_count2 = 0;
  normal_sumX2_2 = 0.0;
  j = 0;
  i = 0;
  normal_sumX2_1 = 0.0;
  no_norm_count1 = 0;
  no_full_count = 0;
  uva[1] = 0.0;
  temp = 0.0;
  sumX2 = 0.0;
  *min_angle = INFINITY;
  *norm_min_angle1 = INFINITY;
  *max_angle = 0.0;
  *norm_max_angle1 = 0.0;
  *norm_min_angle2 = INFINITY;
  *norm_max_angle2 = 0.0;
  *residual = 0.0;
  *density = 0.0;
  *st_dev = 0.0;
  *ave_error = 0.0;
  *norm_density1 = 0.0;
  *norm_st_dev1 = 0.0;
  *norm_ave_error1 = 0.0;
  *norm_density2 = 0.0;
  *norm_st_dev2 = 0.0;
  *norm_ave_error2 = 0.0;
  for (total_count = 0; total_count < 100; total_count = total_count + 1) {
    (&bin_ave)[total_count] = 0.0;
    histogram_error2[(long)total_count + 0x62] = 0.0;
    (&bin_ct)[total_count] = 0;
  }
  total_count = n;
  do {
    if (pic_x - n <= total_count) {
      *density = ((float)no_full_count * 100.0) / (float)no_norm_count2;
      *norm_density1 = ((float)no_norm_count1 * 100.0) / (float)no_norm_count2;
      *norm_density2 = ((float)(int)normal_sumX2_1 * 100.0) / (float)no_norm_count2;
      if (no_full_count == 0) {
        *ave_error = 0.0;
      }
      else {
        *ave_error = *ave_error / (float)no_full_count;
      }
      if (no_norm_count1 == 0) {
        *norm_ave_error1 = 0.0;
      }
      else {
        *norm_ave_error1 = *norm_ave_error1 / (float)no_norm_count1;
      }
      if (normal_sumX2_1 == 0.0) {
        *norm_ave_error2 = 0.0;
      }
      else {
        *norm_ave_error2 = *norm_ave_error2 / (float)(int)normal_sumX2_1;
      }
      if (no_full_count < 2) {
        *st_dev = 0.0;
      }
      else {
        dVar2 = sqrt((double)ABS((-((float)no_full_count * *ave_error) * *ave_error + uva[1]) /
                                 (float)(no_full_count + -1)));
        *st_dev = (float)dVar2;
      }
      if (no_norm_count1 < 2) {
        *norm_st_dev1 = 0.0;
      }
      else {
        dVar2 = sqrt((double)((-((float)no_norm_count1 * *norm_ave_error1) * *norm_ave_error1 +
                              sumX2) / (float)(no_norm_count1 + -1)));
        *norm_st_dev1 = (float)dVar2;
      }
      if ((int)normal_sumX2_1 < 2) {
        *norm_st_dev2 = 0.0;
      }
      else {
        dVar2 = sqrt((double)((-((float)(int)normal_sumX2_1 * *norm_ave_error2) * *norm_ave_error2 +
                              temp) / (float)((int)normal_sumX2_1 + -1)));
        *norm_st_dev2 = (float)dVar2;
      }
      if (no_full_count != 0) {
        *residual = *residual / (float)no_full_count;
      }
      if ((*ave_error == 0.0) && (!NAN(*ave_error))) {
        *max_angle = 0.0;
        *min_angle = 0.0;
      }
      if ((*norm_ave_error1 == 0.0) && (!NAN(*norm_ave_error1))) {
        *norm_max_angle1 = 0.0;
        *norm_min_angle1 = 0.0;
      }
      if ((*norm_ave_error2 == 0.0) && (!NAN(*norm_ave_error2))) {
        *norm_max_angle2 = 0.0;
        *norm_min_angle2 = 0.0;
      }
      printf("\nIn calc_statistics\n");
      printf("%d full velocities\n",(ulong)(uint)no_full_count);
      printf("%d positons without full velocity\n",(ulong)(uint)i);
      printf("%d positions in total\n",(ulong)(uint)no_norm_count2);
      printf("%d least squares normal velocities\n",(ulong)(uint)no_norm_count1);
      printf("%d positons without least squares normal velocity\n",(ulong)(uint)j);
      printf("%d positions with full or least squares normal velocity\n",
             (ulong)(uint)((no_norm_count2 - no_full_count) - no_norm_count1));
      printf("%d raw normal velocities\n",(ulong)(uint)normal_sumX2_1);
      printf("%d positons without raw normal velocity\n",(ulong)(uint)normal_sumX2_2);
      __stream = fopen("lucas.plot.data","w");
      fprintf(__stream,"%d\n",0x19);
      if (RAW_STATISTICS != 0) {
        printf("\n                             Raw Normal Velocity Analysis\n");
        printf("\n                                  Histogram Error\n\n");
        for (total_count = 0; total_count < 0x19; total_count = total_count + 1) {
          if (((double)(&bin_ct)[total_count] != 0.0) || (NAN((double)(&bin_ct)[total_count]))) {
            bin_density = histogram_error2[(long)total_count + 0x62] /
                          ((float)(&bin_ct)[total_count] * 1.0);
          }
          else {
            bin_density = 0.0;
          }
          if ((&bin_ct)[total_count] < 2) {
            uva[0] = 0.0;
          }
          else {
            uva[0] = (-((float)(&bin_ct)[total_count] * bin_density) * bin_density +
                     (&bin_ave)[total_count]) / ((float)(&bin_ct)[total_count] - 1.0);
          }
          histogram_count[0x62] =
               (int)(((float)(&bin_ct)[total_count] * 100.0) / (float)no_norm_count2);
          dVar2 = sqrt(ABS((double)uva[0]));
          histogram_count[99] = (int)(float)dVar2;
          printf("Bin:%5.2f Average Error:%8.5f St. Dev:%8.5f Count:%5d Density:%6.3f\n",
                 (double)total_count + 0.5,SUB84((double)bin_density,0),(double)(float)dVar2,
                 (double)(float)histogram_count[0x62],(ulong)(uint)(&bin_ct)[total_count]);
          fprintf(__stream,"%f %f %f %f\n",(double)total_count + 0.5,SUB84((double)bin_density,0),
                  (double)(float)histogram_count[99],(double)(float)histogram_count[0x62]);
        }
        fprintf(__stream,"\n\n\n");
        fprintf(__stream,"%d\n",0x19);
        printf("\n                                 Cumulative Error\n\n");
        bin_st_dev = 0.0;
        local_550 = 0;
        local_80 = 0.0;
        for (total_count = 0; total_count < 0x19; total_count = total_count + 1) {
          bin_st_dev = histogram_error2[(long)total_count + 0x62] + bin_st_dev;
          local_80 = (&bin_ave)[total_count] + local_80;
          local_550 = (&bin_ct)[total_count] + local_550;
        }
        for (total_count = 0; total_count < 0x19; total_count = total_count + 1) {
          if (local_550 == 0) {
            bin_density = 0.0;
          }
          else {
            bin_density = bin_st_dev / (float)(int)local_550;
          }
          histogram_count[0x62] = (int)(((float)(int)local_550 * 100.0) / (float)no_norm_count2);
          if ((int)local_550 < 2) {
            uva[0] = 0.0;
          }
          else {
            uva[0] = (-((float)(int)local_550 * bin_density) * bin_density + local_80) /
                     (float)(int)(local_550 - 1);
          }
          dVar2 = sqrt(ABS((double)uva[0]));
          histogram_count[99] = (int)(float)dVar2;
          printf("Bin:>%5.2f Average Error:%8.5f St. Dev:%8.5f Count:%5d Density:%6.3f\n",
                 (double)total_count * 1.0,SUB84((double)bin_density,0),
                 (double)(float)histogram_count[99],(double)(float)histogram_count[0x62],
                 (ulong)local_550);
          fprintf(__stream,"%f %f %f %f\n",(double)total_count * 1.0,SUB84((double)bin_density,0),
                  (double)(float)histogram_count[99],(double)(float)histogram_count[0x62]);
          bin_st_dev = bin_st_dev - histogram_error2[(long)total_count + 0x62];
          local_80 = local_80 - (&bin_ave)[total_count];
          local_550 = local_550 - (&bin_ct)[total_count];
        }
        fprintf(__stream,"\n");
        fclose(__stream);
      }
      fflush(_stdout);
      return;
    }
    for (norm_count2 = n; norm_count2 < pic_y - n; norm_count2 = norm_count2 + 1) {
      fVar1 = full_vels[total_count][norm_count2][0];
      if (((fVar1 == 100.0) && (!NAN(fVar1))) ||
         ((fVar1 = full_vels[total_count][norm_count2][1], fVar1 == 100.0 && (!NAN(fVar1))))) {
        i = i + 1;
      }
      else {
        no_full_count = no_full_count + 1;
        local_7c = full_vels[total_count][norm_count2][0];
        bin_err2 = full_vels[total_count][norm_count2][1];
        uve[0] = correct_vels[total_count][norm_count2][0];
        uve[1] = correct_vels[total_count][norm_count2][1];
        fVar1 = PsiER(&local_7c,uve);
        *ave_error = fVar1 + *ave_error;
        if ((E[total_count][norm_count2] == 100.0) && (!NAN(E[total_count][norm_count2]))) {
          printf("Fatal error: E has no value\n");
          exit(1);
        }
        *residual = E[total_count][norm_count2] + *residual;
        uva[1] = fVar1 * fVar1 + uva[1];
        if (fVar1 < *min_angle) {
          *min_angle = fVar1;
        }
        if (*max_angle <= fVar1 && fVar1 != *max_angle) {
          *max_angle = fVar1;
        }
      }
      fVar1 = norm_vels1[total_count][norm_count2][0];
      if (((fVar1 == 100.0) && (!NAN(fVar1))) ||
         ((fVar1 = norm_vels1[total_count][norm_count2][1], fVar1 == 100.0 && (!NAN(fVar1))))) {
        j = j + 1;
      }
      else {
        no_norm_count1 = no_norm_count1 + 1;
        local_7c = norm_vels1[total_count][norm_count2][0];
        bin_err2 = norm_vels1[total_count][norm_count2][1];
        uve[0] = correct_vels[total_count][norm_count2][0];
        uve[1] = correct_vels[total_count][norm_count2][1];
        fVar1 = PsiEN(&local_7c,uve);
        *norm_ave_error1 = fVar1 + *norm_ave_error1;
        sumX2 = fVar1 * fVar1 + sumX2;
        if (fVar1 < *norm_min_angle1) {
          *norm_min_angle1 = fVar1;
        }
        if (*norm_max_angle1 <= fVar1 && fVar1 != *norm_max_angle1) {
          *norm_max_angle1 = fVar1;
        }
      }
      fVar1 = norm_vels2[total_count][norm_count2][0];
      if (((fVar1 == 100.0) && (!NAN(fVar1))) ||
         ((fVar1 = norm_vels2[total_count][norm_count2][1], fVar1 == 100.0 && (!NAN(fVar1))))) {
        normal_sumX2_2 = (float)((int)normal_sumX2_2 + 1);
      }
      else {
        normal_sumX2_1 = (float)((int)normal_sumX2_1 + 1);
        local_7c = norm_vels2[total_count][norm_count2][0];
        bin_err2 = norm_vels2[total_count][norm_count2][1];
        uve[0] = correct_vels[total_count][norm_count2][0];
        uve[1] = correct_vels[total_count][norm_count2][1];
        fVar1 = PsiEN(&local_7c,uve);
        *norm_ave_error2 = fVar1 + *norm_ave_error2;
        temp = fVar1 * fVar1 + temp;
        if (fVar1 < *norm_min_angle2) {
          *norm_min_angle2 = fVar1;
        }
        if (*norm_max_angle2 <= fVar1 && fVar1 != *norm_max_angle2) {
          *norm_max_angle2 = fVar1;
        }
        local_54c = (int)Imag[total_count][norm_count2];
        if (0x18 < local_54c) {
          local_54c = 0x19;
        }
        histogram_error2[(long)local_54c + 0x62] = fVar1 + histogram_error2[(long)local_54c + 0x62];
        (&bin_ave)[local_54c] = fVar1 * fVar1 + (&bin_ave)[local_54c];
        (&bin_ct)[local_54c] = (&bin_ct)[local_54c] + 1;
      }
      no_norm_count2 = no_norm_count2 + 1;
    }
    total_count = total_count + 1;
  } while( true );
}

Assistant:

void calc_statistics(float correct_vels[PIC_X][PIC_Y][2],
				float norm_vels1[PIC_X][PIC_Y][2],
				float norm_vels2[PIC_X][PIC_Y][2],
				int int_size_x, int int_size_y,
				float full_vels[PIC_X][PIC_Y][2],
				float E[PIC_X][PIC_Y], int pic_x,
				int pic_y, int n, float *ave_error,
				float *st_dev,float *density, float *residual,
				float *min_angle, float *max_angle,
				float *norm_ave_error1,float *norm_st_dev1,
				float *norm_density1, float *norm_min_angle1,
				float *norm_max_angle1, float *norm_ave_error2,
				float *norm_st_dev2, float *norm_density2,
				float *norm_min_angle2, float *norm_max_angle2)
{
FILE *fp;
int full_count,norm_count1,no_full_count,no_norm_count1,i,j,total_count;
int norm_count2,no_norm_count2;
float normal_sumX2_1,normal_sumX2_2,sumX2,temp,uva[2],uve[2],bin_err2;
float histogram_error[100],histogram_error2[100],bin_sum,bin_ave,bin_st_dev;
float bin_density;
int histogram_count[100],int_mag,bin_ct;

full_count = norm_count1 = norm_count2 = no_full_count = no_norm_count1 = no_norm_count2 = total_count = 0;
normal_sumX2_1 = normal_sumX2_2 = sumX2 = 0.0;
(*norm_min_angle1) = (*min_angle) = (float) HUGE_VAL;
(*norm_max_angle1) = (*max_angle) = 0.0f;
(*norm_min_angle2) = (float) HUGE_VAL;
(*norm_max_angle2) = 0.0f;
(*ave_error) = (*st_dev) = (*density) = (*residual) = 0.0f;
(*norm_ave_error1) = (*norm_st_dev1) = (*norm_density1) = 0.0f;
(*norm_ave_error2) = (*norm_st_dev2) = (*norm_density2) = 0.0f;

for(i=0;i<100;i++) { histogram_error[i]=histogram_error2[i]=0.0; histogram_count[i]=0; }


for(i=n;i<pic_x-n;i++)
{
for(j=n;j<pic_y-n;j++)
	{
	if(full_vels[i][j][0] != NO_VALUE && full_vels[i][j][1] != NO_VALUE)
	  {
	  full_count++;
	  uve[0] = full_vels[i][j][0]; uve[1] = full_vels[i][j][1];
	  uva[0] = correct_vels[i][j][0]; uva[1] = correct_vels[i][j][1];
	  temp = PsiER(uve,uva);
	  (*ave_error) += temp;
	  if(E[i][j] == NO_VALUE)
		{ printf("Fatal error: E has no value\n"); exit(1); }
	  (*residual) += E[i][j];
	  sumX2 += temp*temp;
	  if(temp < (*min_angle)) (*min_angle) = temp;
	  if(temp > (*max_angle)) (*max_angle) = temp;
	  }
	else no_full_count++;

	if(norm_vels1[i][j][0] != NO_VALUE && norm_vels1[i][j][1] != NO_VALUE)
	  {
	  norm_count1++;
	  uve[0] = norm_vels1[i][j][0]; uve[1] = norm_vels1[i][j][1];
	  uva[0] = correct_vels[i][j][0]; uva[1] = correct_vels[i][j][1];
	  temp = PsiEN(uve,uva);
	  (*norm_ave_error1) += temp;
	  normal_sumX2_1 += temp*temp;
	  if(temp < (*norm_min_angle1)) (*norm_min_angle1) = temp;
	  if(temp > (*norm_max_angle1)) (*norm_max_angle1) = temp;
	  }
	else no_norm_count1++;

	if(norm_vels2[i][j][0] != NO_VALUE && norm_vels2[i][j][1] != NO_VALUE)
	  {
	  norm_count2++;
	  uve[0] = norm_vels2[i][j][0]; uve[1] = norm_vels2[i][j][1];
	  uva[0] = correct_vels[i][j][0]; uva[1] = correct_vels[i][j][1];
	  temp = PsiEN(uve,uva);
	  (*norm_ave_error2) += temp;
	  normal_sumX2_2 += temp*temp;
	  if(temp < (*norm_min_angle2)) (*norm_min_angle2) = temp;
	  if(temp > (*norm_max_angle2)) (*norm_max_angle2) = temp;
	  int_mag = (int) (Imag[i][j]);
	  if(int_mag >= MAX_I) int_mag = MAX_I;
	  histogram_error[int_mag] += temp;
	  histogram_error2[int_mag] += temp*temp;
	  histogram_count[int_mag]++;
	  }
	else no_norm_count2++;

	total_count++;
	}
}
(*density) = (full_count*100.0f)/(total_count);
(*norm_density1) = (norm_count1*100.0f)/(total_count);
(*norm_density2) = (norm_count2*100.0f)/(total_count);

if(full_count != 0) (*ave_error) = (*ave_error)/full_count;
else (*ave_error) = 0.0;
if(norm_count1 != 0) (*norm_ave_error1) = (*norm_ave_error1)/norm_count1;
else (*norm_ave_error1) = 0.0;
if(norm_count2 != 0) (*norm_ave_error2) = (*norm_ave_error2)/norm_count2;
else (*norm_ave_error2) = 0.0;

if(full_count > 1)
{
temp =(float) (fabs((sumX2 - full_count*(*ave_error)*(*ave_error))/(full_count-1)));
(*st_dev) = (float) sqrt(temp);
}
else (*st_dev) = 0.0f;
if(norm_count1 > 1)
(*norm_st_dev1) = (float) (sqrt((normal_sumX2_1 - norm_count1*(*norm_ave_error1)*(*norm_ave_error1))/(norm_count1-1)));
else (*norm_st_dev1) = 0.0;
if(norm_count2 > 1)
(*norm_st_dev2) = (float) (sqrt((normal_sumX2_2 - norm_count2*(*norm_ave_error2)*(*norm_ave_error2))/(norm_count2-1)));
else (*norm_st_dev2) = 0.0;

if(full_count != 0) (*residual) = (*residual)/full_count;
if((*ave_error) == 0.0) { (*min_angle) = (*max_angle) = 0.0; }
if((*norm_ave_error1) == 0.0) { (*norm_min_angle1) = (*norm_max_angle1) = 0.0; }
if((*norm_ave_error2) == 0.0) { (*norm_min_angle2) = (*norm_max_angle2) = 0.0; }

printf("\nIn calc_statistics\n");
printf("%d full velocities\n",full_count);
printf("%d positons without full velocity\n",no_full_count);
printf("%d positions in total\n",total_count);
printf("%d least squares normal velocities\n",norm_count1);
printf("%d positons without least squares normal velocity\n",no_norm_count1);
printf("%d positions with full or least squares normal velocity\n",
	total_count-full_count-norm_count1);
printf("%d raw normal velocities\n",norm_count2);
printf("%d positons without raw normal velocity\n",no_norm_count2);

fp =fopen("lucas.plot.data","w");
fprintf(fp,"%d\n",MAX_I);
if(RAW_STATISTICS)
{
printf("\n                             Raw Normal Velocity Analysis\n");
printf("\n                                  Histogram Error\n\n");
for(i=0;i<MAX_I;i++)
	{
     	if(histogram_count[i] != 0.0) bin_ave = histogram_error[i]/(histogram_count[i]*1.0f);
     	else bin_ave = 0.0;
	if(histogram_count[i] > 1) temp = ((histogram_error2[i]-histogram_count[i]*bin_ave*bin_ave)/(histogram_count[i]-1.0f));
	else temp = 0.0;
	bin_density = histogram_count[i]*100.0f/total_count;
	bin_st_dev = (float) sqrt(fabs(temp));
     	printf("Bin:%5.2f Average Error:%8.5f St. Dev:%8.5f Count:%5d Density:%6.3f\n",i+0.5,bin_ave,bin_st_dev,histogram_count[i],bin_density);
     	fprintf(fp,"%f %f %f %f\n",i+0.5,bin_ave,bin_st_dev,bin_density);
	}
fprintf(fp,"\n\n\n");
fprintf(fp,"%d\n",MAX_I);
printf("\n                                 Cumulative Error\n\n");
bin_sum = 0.0; bin_ct=0; bin_err2 = 0.0;
for(i=0;i<MAX_I;i++)
     {
     bin_sum += histogram_error[i];
     bin_err2 += histogram_error2[i];
     bin_ct += histogram_count[i];
     }
for(i=0;i<MAX_I;i++)
     {
     if(bin_ct != 0) bin_ave = bin_sum/bin_ct; else bin_ave = 0.0;
     bin_density = bin_ct*100.0f/total_count;
     if(bin_ct > 1)  temp = ((bin_err2-bin_ct*bin_ave*bin_ave)/(bin_ct-1));
     else temp = 0.0;
     bin_st_dev = (float) sqrt(fabs(temp));
     printf("Bin:>%5.2f Average Error:%8.5f St. Dev:%8.5f Count:%5d Density:%6.3f\n",i*1.0,bin_ave,bin_st_dev,bin_ct,bin_density);
     fprintf(fp,"%f %f %f %f\n",i*1.0,bin_ave,bin_st_dev,bin_density);
     bin_sum -= histogram_error[i];
     bin_err2 -= histogram_error2[i];
     bin_ct -= histogram_count[i];
     }
fprintf(fp,"\n");
fclose(fp);
}
fflush(stdout);
}